

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

mir_size_t var_align(c2m_ctx_t c2m_ctx,type *type)

{
  mir_size_t mVar1;
  mir_size_t mVar2;
  
  raw_type_size(c2m_ctx,type);
  mVar2 = (mir_size_t)type->align;
  if (-1 < (long)mVar2) {
    if (type->mode == TM_ARR) {
      mVar1 = raw_type_size(c2m_ctx,type);
      if (0xf < mVar1) {
        mVar2 = 0x10;
      }
    }
    return mVar2;
  }
  __assert_fail("align >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x17da,"mir_size_t var_align(c2m_ctx_t, struct type *)");
}

Assistant:

static mir_size_t var_align (c2m_ctx_t c2m_ctx, struct type *type) {
  int align;

  raw_type_size (c2m_ctx, type); /* check */
  align = type->align;
  assert (align >= 0);
#ifdef ADJUST_VAR_ALIGNMENT
  align = ADJUST_VAR_ALIGNMENT (c2m_ctx, align, type);
#endif
  return align;
}